

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<false>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  code *pcVar1;
  uint propertyId_00;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext *scriptContext_00;
  DynamicType *pDVar6;
  undefined4 extraout_var;
  DynamicTypeHandler *pDVar7;
  uint32 local_5c;
  ScriptContext *pSStack_58;
  uint32 indexVal;
  ScriptContext *scriptContext;
  ObjectSlotAttributes *attributes;
  PathTypeHandlerBase *pPStack_40;
  bool setAttrDone;
  PathTypeHandlerBase *newTypeHandler;
  bool isInit_local;
  Var pvStack_30;
  ObjectSlotAttributes attr_local;
  Var value_local;
  PropertyIndex index_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  newTypeHandler._6_1_ = isInit;
  pPStack_40 = (PathTypeHandlerBase *)0x0;
  newTypeHandler._7_1_ = attr;
  pvStack_30 = value;
  value_local._2_2_ = index;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  if ((value == (Var)0x0) && (BVar3 = IsInternalPropertyId(propertyId), BVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  propertyId_00 = value_local._4_4_;
  scriptContext_00 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId_00,scriptContext_00);
  if (value_local._2_2_ == 0xffff) {
    pSStack_58 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
    BVar3 = ScriptContext::IsNumericPropertyId(pSStack_58,value_local._4_4_,&local_5c);
    if (BVar3 == 0) {
      this_local._4_4_ =
           AddPropertyInternal(this,pDStack_20,value_local._4_4_,pvStack_30,newTypeHandler._7_1_,
                               info,flags,possibleSideEffects);
    }
    else {
      this_local._4_4_ =
           DynamicTypeHandler::SetItem
                     (&this->super_DynamicTypeHandler,pDStack_20,local_5c,pvStack_30,
                      PropertyOperation_None);
    }
  }
  else {
    pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
    bVar2 = DynamicType::GetIsShared(pDVar6);
    if ((bVar2) &&
       (bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x327,
                                  "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                  "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((newTypeHandler._6_1_ & 1) != 0) {
      iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
      scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar4);
      if ((scriptContext != (ScriptContext *)0x0) &&
         ((*(byte *)((long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo +
                    (ulong)value_local._2_2_) & 0x10) != 0)) {
        BVar3 = SetAttributesHelper(this,pDStack_20,value_local._4_4_,value_local._2_2_,
                                    (ObjectSlotAttributes *)scriptContext,
                                    *(ObjectSlotAttributes *)
                                     ((long)&(scriptContext->super_ScriptContextInfo).
                                             _vptr_ScriptContextInfo + (ulong)value_local._2_2_) &
                                    ~ObjectSlotAttr_Accessor,true);
        attributes._7_1_ = BVar3 != 0;
        if (!(bool)attributes._7_1_) {
          pDVar7 = DynamicObject::GetTypeHandler(pDStack_20);
          iVar4 = (*pDVar7->_vptr_DynamicTypeHandler[0x16])
                            (pDVar7,pDStack_20,(ulong)value_local._4_4_,pvStack_30,(ulong)flags,info
                            );
          return iVar4;
        }
        PropertyValueInfo::SetNoCache(info,&pDStack_20->super_RecyclableObject);
        pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
        pDVar7 = DynamicType::GetTypeHandler(pDVar6);
        pPStack_40 = FromTypeHandler(pDVar7);
        DynamicTypeHandler::SetSlotUnchecked(pDStack_20,(uint)value_local._2_2_,pvStack_30);
        return 1;
      }
    }
    pDVar6 = DynamicObject::GetDynamicType(pDStack_20);
    pDVar7 = DynamicType::GetTypeHandler(pDVar6);
    pPStack_40 = FromTypeHandler(pDVar7);
    SetSlotAndCache(pPStack_40,pDStack_20,value_local._4_4_,(PropertyRecord *)0x0,value_local._2_2_,
                    pvStack_30,info,flags,possibleSideEffects);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }